

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O0

QCursor __thiscall QGraphicsItem::cursor(QGraphicsItem *this)

{
  long lVar1;
  QVariant *in_RSI;
  QCursorData *in_RDI;
  long in_FS_OFFSET;
  QCursorData *pQVar2;
  undefined8 in_stack_ffffffffffffffd8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = in_RDI;
  QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::operator->
            ((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_> *)
             ((long)&(in_RSI->d).data + 8));
  QGraphicsItemPrivate::extra
            ((QGraphicsItemPrivate *)in_stack_ffffffffffffffd8,(Extra)((ulong)pQVar2 >> 0x20));
  qvariant_cast<QCursor>(in_RSI);
  ::QVariant::~QVariant((QVariant *)&stack0xffffffffffffffd8);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (QCursor)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QCursor QGraphicsItem::cursor() const
{
    return qvariant_cast<QCursor>(d_ptr->extra(QGraphicsItemPrivate::ExtraCursor));
}